

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_allocator.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnDataAllocator::UnswizzlePointers
          (ColumnDataAllocator *this,ChunkManagementState *state,Vector *result,idx_t v_offset,
          uint16_t count,uint32_t block_id,uint32_t offset)

{
  unsigned_long *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  data_ptr_t pdVar5;
  uint *puVar6;
  ulong uVar7;
  data_ptr_t pdVar8;
  long lVar9;
  data_ptr_t pdVar10;
  ulong uVar11;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  FlatVector::VerifyFlatVector(result);
  pdVar10 = result->data;
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(v_offset);
  uVar11 = (ulong)uVar3;
  uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(count + v_offset);
  if (uVar3 < uVar4) {
    puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    uVar11 = (ulong)uVar3;
    puVar6 = (uint *)(pdVar10 + uVar11 * 0x10);
    do {
      if (((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
         && (0xc < *puVar6)) goto LAB_00d8c0de;
      uVar11 = uVar11 + 1;
      puVar6 = puVar6 + 4;
    } while (uVar4 != (uint)uVar11);
    uVar11 = (ulong)uVar4;
  }
LAB_00d8c0de:
  pdVar5 = GetDataPointer(this,state,block_id,offset);
  uVar7 = uVar11 & 0xffffffff;
  lVar9 = uVar7 * 0x10;
  if (*(uint *)(pdVar10 + lVar9) < 0xd) {
    pdVar8 = pdVar10 + lVar9 + 4;
  }
  else {
    pdVar8 = *(data_ptr_t *)(pdVar10 + lVar9 + 8);
  }
  if ((pdVar8 != pdVar5) && ((uint)uVar11 < uVar4)) {
    pdVar10 = pdVar10 + lVar9 + 8;
    do {
      puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) &&
         (0xc < (ulong)*(uint *)(pdVar10 + -8))) {
        *(data_ptr_t *)pdVar10 = pdVar5;
        pdVar5 = pdVar5 + *(uint *)(pdVar10 + -8);
      }
      uVar7 = uVar7 + 1;
      pdVar10 = pdVar10 + 0x10;
    } while (uVar4 != uVar7);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void ColumnDataAllocator::UnswizzlePointers(ChunkManagementState &state, Vector &result, idx_t v_offset, uint16_t count,
                                            uint32_t block_id, uint32_t offset) {
	D_ASSERT(result.GetType().InternalType() == PhysicalType::VARCHAR);
	lock_guard<mutex> guard(lock);

	auto &validity = FlatVector::Validity(result);
	auto strings = FlatVector::GetData<string_t>(result);

	// find first non-inlined string
	auto i = NumericCast<uint32_t>(v_offset);
	const uint32_t end = NumericCast<uint32_t>(v_offset + count);
	for (; i < end; i++) {
		if (!validity.RowIsValid(i)) {
			continue;
		}
		if (!strings[i].IsInlined()) {
			break;
		}
	}
	// at least one string must be non-inlined, otherwise this function should not be called
	D_ASSERT(i < end);

	auto base_ptr = char_ptr_cast(GetDataPointer(state, block_id, offset));
	if (strings[i].GetData() == base_ptr) {
		// pointers are still valid
		return;
	}

	// pointer mismatch! pointers are invalid, set them correctly
	for (; i < end; i++) {
		if (!validity.RowIsValid(i)) {
			continue;
		}
		if (strings[i].IsInlined()) {
			continue;
		}
		strings[i].SetPointer(base_ptr);
		base_ptr += strings[i].GetSize();
	}
}